

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint64 HashLen33to64(char *s,size_t len)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  uint64 uVar5;
  uint64 uVar6;
  uint64 uVar7;
  long lVar8;
  uint64 uVar9;
  uint64 uVar10;
  long in_RSI;
  uint64 r;
  uint64 ws;
  uint64 wf;
  uint64 vs;
  uint64 vf;
  uint64 c;
  uint64 b;
  uint64 a;
  uint64 z;
  
  uVar1 = Fetch64((char *)0x2531c5);
  uVar2 = Fetch64((char *)0x2531d7);
  uVar3 = Fetch64((char *)0x2531fc);
  uVar2 = uVar2 + (in_RSI + uVar3) * -0x3c5a37a36834ced9;
  uVar3 = Rotate(uVar2 + uVar1,0x34);
  uVar4 = Rotate(uVar2,0x25);
  uVar5 = Fetch64((char *)0x253260);
  uVar6 = Rotate(uVar5 + uVar2,7);
  uVar7 = Fetch64((char *)0x253294);
  uVar7 = uVar7 + uVar5 + uVar2;
  uVar2 = Rotate(uVar7,0x1f);
  lVar8 = uVar3 + uVar2 + uVar6 + uVar4;
  uVar2 = Fetch64((char *)0x2532ec);
  uVar3 = Fetch64((char *)0x253307);
  uVar2 = uVar2 + uVar3;
  uVar3 = Fetch64((char *)0x25332d);
  uVar4 = Rotate(uVar2 + uVar3,0x34);
  uVar5 = Rotate(uVar2,0x25);
  uVar6 = Fetch64((char *)0x253375);
  uVar9 = Rotate(uVar6 + uVar2,7);
  uVar10 = Fetch64((char *)0x2533ae);
  uVar10 = uVar10 + uVar6 + uVar2;
  uVar2 = Rotate(uVar10,0x1f);
  uVar1 = ShiftMix((uVar7 + uVar1 + uVar4 + uVar2 + uVar9 + uVar5) * -0x651e95c4d06fbfb1 +
                   (uVar10 + uVar3 + lVar8) * -0x3c5a37a36834ced9);
  uVar1 = ShiftMix(uVar1 * -0x3c5a37a36834ced9 + lVar8);
  return uVar1 * -0x651e95c4d06fbfb1;
}

Assistant:

static uint64 HashLen33to64(const char *s, size_t len) {
  uint64 z = Fetch64(s + 24);
  uint64 a = Fetch64(s) + (len + Fetch64(s + len - 16)) * k0;
  uint64 b = Rotate(a + z, 52);
  uint64 c = Rotate(a, 37);
  a += Fetch64(s + 8);
  c += Rotate(a, 7);
  a += Fetch64(s + 16);
  uint64 vf = a + z;
  uint64 vs = b + Rotate(a, 31) + c;
  a = Fetch64(s + 16) + Fetch64(s + len - 32);
  z = Fetch64(s + len - 8);
  b = Rotate(a + z, 52);
  c = Rotate(a, 37);
  a += Fetch64(s + len - 24);
  c += Rotate(a, 7);
  a += Fetch64(s + len - 16);
  uint64 wf = a + z;
  uint64 ws = b + Rotate(a, 31) + c;
  uint64 r = ShiftMix((vf + ws) * k2 + (wf + vs) * k0);
  return ShiftMix(r * k0 + vs) * k2;
}